

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode http_perhapsrewind(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLcode extraout_EAX;
  curl_off_t cVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  
  lVar1 = (data->req).writebytecount;
  cVar6 = Curl_creader_total_length(data);
  uVar11 = 0xffffffffffffffff;
  if (-1 < cVar6) {
    uVar11 = cVar6 - lVar1;
  }
  _Var4 = Curl_creader_needs_rewind(data);
  uVar8 = *(uint *)&(data->req).field_0xd9;
  uVar7 = extraout_var;
  if (_Var4) {
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Need to rewind upload for next request");
    }
    Curl_creader_set_rewind(data,true);
    uVar7 = extraout_var_00;
  }
  CVar5 = (CURLcode)CONCAT71(uVar7,uVar11 < 2000);
  if ((((ulong)conn->bits & 0x20) == 0 && (uVar8 & 0x100) == 0) && uVar11 >= 2000) {
    if (((data->state).authproxy.picked == 8) || ((data->state).authhost.picked == 8)) {
      if (conn->http_ntlm_state != NTLMSTATE_NONE) {
        return CVar5;
      }
      if (conn->proxy_ntlm_state != NTLMSTATE_NONE) {
        return CVar5;
      }
      pcVar10 = "NTML";
      bVar3 = false;
    }
    else {
      bVar3 = true;
      pcVar10 = (char *)0x0;
    }
    uVar8 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
    if ((long)uVar11 < 0) {
      if (((uVar8 >> 0x1c & 1) != 0) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        if (bVar3) {
          pcVar10 = "";
        }
        pcVar9 = " send, ";
        if (bVar3) {
          pcVar9 = "";
        }
        Curl_infof(data,"%s%sclose instead of sending unknown amount of more bytes",pcVar10,pcVar9);
      }
    }
    else if (((uVar8 >> 0x1c & 1) != 0) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) {
      if (bVar3) {
        pcVar10 = "";
      }
      pcVar9 = " send, ";
      if (bVar3) {
        pcVar9 = "";
      }
      Curl_infof(data,"%s%sclose instead of sending %ld more bytes",pcVar10,pcVar9,uVar11);
    }
    Curl_conncontrol(conn,2);
    (data->req).size = 0;
    CVar5 = extraout_EAX;
  }
  return CVar5;
}

Assistant:

static CURLcode http_perhapsrewind(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  curl_off_t bytessent = data->req.writebytecount;
  curl_off_t expectsend = Curl_creader_total_length(data);
  curl_off_t upload_remain = (expectsend >= 0) ? (expectsend - bytessent) : -1;
  bool little_upload_remains = (upload_remain >= 0 && upload_remain < 2000);
  bool needs_rewind = Curl_creader_needs_rewind(data);
  /* By default, we would like to abort the transfer when little or unknown
   * amount remains. This may be overridden by authentications further
   * below! */
  bool abort_upload = (!data->req.upload_done && !little_upload_remains);
  const char *ongoing_auth = NULL;

  /* We need a rewind before uploading client read data again. The
   * checks below just influence of the upload is to be continued
   * or aborted early.
   * This depends on how much remains to be sent and in what state
   * the authentication is. Some auth schemes such as NTLM do not work
   * for a new connection. */
  if(needs_rewind) {
    infof(data, "Need to rewind upload for next request");
    Curl_creader_set_rewind(data, TRUE);
  }

  if(conn->bits.close)
    /* If we already decided to close this connection, we cannot veto. */
    return CURLE_OK;

  if(abort_upload) {
    /* We'd like to abort the upload - but should we? */
#if defined(USE_NTLM)
    if((data->state.authproxy.picked == CURLAUTH_NTLM) ||
       (data->state.authhost.picked == CURLAUTH_NTLM)) {
      ongoing_auth = "NTML";
      if((conn->http_ntlm_state != NTLMSTATE_NONE) ||
         (conn->proxy_ntlm_state != NTLMSTATE_NONE)) {
        /* The NTLM-negotiation has started, keep on sending.
         * Need to do further work on same connection */
        abort_upload = FALSE;
      }
    }
#endif
#if defined(USE_SPNEGO)
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NEGOTIATE) ||
       (data->state.authhost.picked == CURLAUTH_NEGOTIATE)) {
      ongoing_auth = "NEGOTIATE";
      if((conn->http_negotiate_state != GSS_AUTHNONE) ||
         (conn->proxy_negotiate_state != GSS_AUTHNONE)) {
        /* The NEGOTIATE-negotiation has started, keep on sending.
         * Need to do further work on same connection */
        abort_upload = FALSE;
      }
    }
#endif
  }

  if(abort_upload) {
    if(upload_remain >= 0)
      infof(data, "%s%sclose instead of sending %" FMT_OFF_T " more bytes",
            ongoing_auth ? ongoing_auth : "",
            ongoing_auth ? " send, " : "",
            upload_remain);
    else
      infof(data, "%s%sclose instead of sending unknown amount "
            "of more bytes",
            ongoing_auth ? ongoing_auth : "",
            ongoing_auth ? " send, " : "");
    /* We decided to abort the ongoing transfer */
    streamclose(conn, "Mid-auth HTTP and much data left to send");
    /* FIXME: questionable manipulation here, can we do this differently? */
    data->req.size = 0; /* do not download any more than 0 bytes */
  }
  return CURLE_OK;
}